

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

xml_node * xml_easy_child(xml_node *node,uint8_t *child_name,...)

{
  xml_node *pxVar1;
  char in_AL;
  _Bool _Var2;
  xml_node *pxVar3;
  xml_string *a;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_148;
  undefined8 local_128 [4];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  xml_node *local_70;
  xml_node *child;
  size_t i;
  xml_node *next;
  xml_string cn;
  va_list arguments;
  xml_node *local_28;
  xml_node *current;
  uint8_t *child_name_local;
  xml_node *node_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  arguments[0]._0_8_ = &stack0x00000008;
  cn.length._4_4_ = 0x30;
  cn.length._0_4_ = 0x10;
  local_128[2] = in_RDX;
  local_128[3] = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  local_28 = node;
  current = (xml_node *)child_name;
  while( true ) {
    if (current == (xml_node *)0x0) {
      return local_28;
    }
    next = current;
    cn.buffer = (uint8_t *)strlen((char *)current);
    i = 0;
    for (child = (xml_node *)0x0; pxVar1 = child, pxVar3 = (xml_node *)xml_node_children(local_28),
        pxVar1 < pxVar3; child = (xml_node *)((long)&child->name + 1)) {
      local_70 = xml_node_child(local_28,(size_t)child);
      a = xml_node_name(local_70);
      _Var2 = xml_string_equals(a,(xml_string *)&next);
      if (_Var2) {
        if (i != 0) {
          return (xml_node *)0x0;
        }
        i = (size_t)local_70;
      }
    }
    if (i == 0) break;
    local_28 = (xml_node *)i;
    if ((uint)cn.length < 0x29) {
      local_148 = (undefined8 *)((long)local_128 + (long)(int)(uint)cn.length);
      cn.length._0_4_ = (uint)cn.length + 8;
    }
    else {
      local_148 = (undefined8 *)arguments[0]._0_8_;
      arguments[0]._0_8_ = arguments[0]._0_8_ + 8;
    }
    current = (xml_node *)*local_148;
  }
  return (xml_node *)0x0;
}

Assistant:

struct xml_node* xml_easy_child(struct xml_node* node, uint8_t const* child_name, ...) {

	/* Find children, one by one
	 */
	struct xml_node* current = node;

	va_list arguments;
	va_start(arguments, child_name);


	/* Descent to current.child
	 */
	while (child_name) {

		/* Convert child_name to xml_string for easy comparison
		 */
		struct xml_string cn = {
			.buffer = child_name,
			.length = strlen(child_name)
		};

		/* Interate through all children
		 */
		struct xml_node* next = 0;

		size_t i = 0; for (; i < xml_node_children(current); ++i) {
			struct xml_node* child = xml_node_child(current, i);

			if (xml_string_equals(xml_node_name(child), &cn)) {
				if (!next) {
					next = child;

				/* Two children with the same name
				 */
				} else {
					va_end(arguments);
					return 0;
				}
			}
		}

		/* No child with that name found
		 */
		if (!next) {
			va_end(arguments);
			return 0;
		}
		current = next;		
		
		/* Find name of next child
		 */
		child_name = va_arg(arguments, uint8_t const*);
	}
	va_end(arguments);


	/* Return current element
	 */
	return current;
}